

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GrcManager::CmapAndInverse
          (GrcManager *this,GrcFont *pfont,int cnUni,utf16 *rgchwUniToGlyphID,uint *rgnGlyphIDToUni,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnXUniForPsd,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vwXPsdForUni)

{
  bool bVar1;
  uint uVar2;
  size_type_conflict sVar3;
  reference pvVar4;
  reference pvVar5;
  void *in_RCX;
  int in_EDX;
  long in_RDI;
  void *in_R8;
  iterator iVar6;
  GrcFont *in_stack_00000008;
  utf16 wGlyph;
  uint nUni;
  int iUniPsd;
  iterator fit;
  int iUni;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 fAtEnd;
  GrcFont *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  GrcFont *local_70;
  GrcFont *rgchwUniToGlyphID_00;
  GrcFont *in_stack_ffffffffffffffa0;
  uint local_58;
  uint uStack_54;
  int local_4c;
  iterator local_48;
  int local_34;
  void *local_28;
  void *local_20;
  
  fAtEnd = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
  local_28 = in_R8;
  local_20 = in_RCX;
  rgchwUniToGlyphID_00 = local_70;
  memset(in_RCX,0,(long)in_EDX << 1);
  memset(local_28,0,0x40000);
  GrcFont::GetGlyphsFromCmap(in_stack_ffffffffffffffa0,(utf16 *)rgchwUniToGlyphID_00);
  GrcFont::iterator::iterator
            ((iterator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,(bool)fAtEnd);
  local_4c = 0;
  local_34 = 0;
  iVar6 = GrcFont::Begin((GrcFont *)0x11f56c);
  local_48.m_pfont = iVar6.m_pfont;
  _local_58 = iVar6._8_8_;
  local_48.m_nUni = local_58;
  local_48.m_iBlock = uStack_54;
  while( true ) {
    GrcFont::End((GrcFont *)0x11f597);
    bVar1 = GrcFont::iterator::operator!=(&local_48,(iterator *)&local_70);
    if (!bVar1) break;
    uVar2 = GrcFont::iterator::operator*(&local_48);
    while( true ) {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x180));
      bVar1 = false;
      if (local_4c < (int)sVar3) {
        in_stack_ffffffffffffff74 = uVar2;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x180),
                            (long)local_4c);
        bVar1 = *pvVar4 < in_stack_ffffffffffffff74;
      }
      if (!bVar1) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x180),
                 (long)local_4c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (value_type_conflict *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff68 = in_stack_00000008;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x198),
                 (long)local_4c);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (value_type_conflict2 *)in_stack_ffffffffffffff68);
      local_4c = local_4c + 1;
    }
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x180));
    if (local_4c < (int)sVar3) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x180),
                          (long)local_4c);
      if (*pvVar4 == uVar2) {
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x198),(long)local_4c);
        *(value_type *)((long)local_20 + (long)local_34 * 2) = *pvVar5;
        local_4c = local_4c + 1;
      }
    }
    *(uint *)((long)local_28 + (ulong)*(ushort *)((long)local_20 + (long)local_34 * 2) * 4) = uVar2;
    GrcFont::iterator::operator++
              ((iterator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void GrcManager::CmapAndInverse(GrcFont * pfont, 
	int cnUni, utf16 * rgchwUniToGlyphID, unsigned int * rgnGlyphIDToUni,
	std::vector<unsigned int> & vnXUniForPsd, std::vector<utf16> & vwXPsdForUni)
{
	memset(rgchwUniToGlyphID, 0, (cnUni * sizeof(utf16)));
	memset(rgnGlyphIDToUni, 0, (0x10000 * sizeof(int)));

	pfont->GetGlyphsFromCmap(rgchwUniToGlyphID);

	// Generate the inverse cmap. Also overwrite the glyph IDs for any pseudos.
	int iUni;
	GrcFont::iterator fit(pfont);
	int iUniPsd = 0;
	for (iUni = 0, fit = pfont->Begin();
		fit != pfont->End();
		++fit, ++iUni)
	{
		unsigned int nUni = *fit;

		// Handle pseudos.
		while (iUniPsd < signed(m_vnUnicodeForPseudo.size()) && nUni > m_vnUnicodeForPseudo[iUniPsd])
		{
			// Put any Unicode -> pseudo mappings where the Unicode is not in the cmap into 
			// a separate list.
			vnXUniForPsd.push_back(m_vnUnicodeForPseudo[iUniPsd]);
			vwXPsdForUni.push_back(m_vwPseudoForUnicode[iUniPsd]);
			iUniPsd++;
		}
		if (iUniPsd < signed(m_vnUnicodeForPseudo.size()) && m_vnUnicodeForPseudo[iUniPsd] == nUni)
		{
			// Pseudo: overwrite glyph ID.
			rgchwUniToGlyphID[iUni] = m_vwPseudoForUnicode[iUniPsd];
			iUniPsd++;
		}
		utf16 wGlyph = rgchwUniToGlyphID[iUni];
		rgnGlyphIDToUni[wGlyph] = nUni;
	}
	Assert(iUni == cnUni);
}